

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_MapEntryKeyTypeMessage_Test::
~ValidationErrorTest_MapEntryKeyTypeMessage_Test
          (ValidationErrorTest_MapEntryKeyTypeMessage_Test *this)

{
  ValidationErrorTest_MapEntryKeyTypeMessage_Test *this_local;
  
  ~ValidationErrorTest_MapEntryKeyTypeMessage_Test(this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, MapEntryKeyTypeMessage) {
  FileDescriptorProto file_proto;
  FillValidMapEntry(&file_proto);
  FieldDescriptorProto* key =
      file_proto.mutable_message_type(0)->mutable_nested_type(0)->mutable_field(
          0);
  key->clear_type();
  key->set_type_name(".Bar");
  BuildFileWithErrors(file_proto, kMapEntryKeyTypeErrorMessage);
}